

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

iterator __thiscall
llvm::SmallVectorImpl<char>::erase(SmallVectorImpl<char> *this,const_iterator CS,const_iterator CE)

{
  const_iterator pcVar1;
  ptrdiff_t _Num;
  size_t __n;
  
  pcVar1 = (const_iterator)
           (this->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  if (CS < pcVar1) {
    __assert_fail("S >= this->begin() && \"Range to erase is out of bounds.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0x1d1,
                  "iterator llvm::SmallVectorImpl<char>::erase(const_iterator, const_iterator) [T = char]"
                 );
  }
  if (CS <= CE) {
    __n = (long)(pcVar1 + (this->super_SmallVectorTemplateBase<char,_true>).
                          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size) -
          (long)CE;
    if (CE <= pcVar1 + (this->super_SmallVectorTemplateBase<char,_true>).
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size) {
      if (__n != 0) {
        memmove(CS,CE,__n);
        pcVar1 = (const_iterator)
                 (this->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      }
      SmallVectorBase::set_size((SmallVectorBase *)this,(size_t)(CS + (__n - (long)pcVar1)));
      return CS;
    }
    __assert_fail("E <= this->end() && \"Trying to erase past the end.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0x1d3,
                  "iterator llvm::SmallVectorImpl<char>::erase(const_iterator, const_iterator) [T = char]"
                 );
  }
  __assert_fail("S <= E && \"Trying to erase invalid range.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x1d2,
                "iterator llvm::SmallVectorImpl<char>::erase(const_iterator, const_iterator) [T = char]"
               );
}

Assistant:

LLVM_ATTRIBUTE_ALWAYS_INLINE
  iterator begin() { return (iterator)this->BeginX; }